

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImGuiTextBuffer::ImGuiTextBuffer(ImGuiTextBuffer *this)

{
  char *pcVar1;
  char *__dest;
  
  (this->Buf).Size = 0;
  (this->Buf).Capacity = 0;
  (this->Buf).Data = (char *)0x0;
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  __dest = (char *)(*GImAllocatorAllocFunc)(8,GImAllocatorUserData);
  pcVar1 = (this->Buf).Data;
  if (pcVar1 != (char *)0x0) {
    memcpy(__dest,pcVar1,(long)(this->Buf).Size);
    pcVar1 = (this->Buf).Data;
    if (pcVar1 != (char *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    }
    (*GImAllocatorFreeFunc)(pcVar1,GImAllocatorUserData);
  }
  (this->Buf).Data = __dest;
  (this->Buf).Capacity = 8;
  __dest[(this->Buf).Size] = '\0';
  (this->Buf).Size = (this->Buf).Size + 1;
  return;
}

Assistant:

ImGuiTextBuffer()   { Buf.push_back(0); }